

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueDescriptorProto::MergeFrom
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  uint uVar1;
  EnumValueOptions *in_RSI;
  EnumValueDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  UnknownFieldSet *in_stack_ffffffffffffff08;
  EnumValueDescriptorProto *in_stack_ffffffffffffff10;
  EnumValueDescriptorProto *this_00;
  string *in_stack_ffffffffffffff28;
  EnumValueOptions *in_stack_ffffffffffffff88;
  
  this_00 = (EnumValueDescriptorProto *)&in_RSI->_extensions_;
  if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
    if (((uint)((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 *)&((ExtensionSet *)this_00)->arena_)->ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)this_00);
      in_stack_ffffffffffffff10 = this_00;
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
      in_stack_ffffffffffffff10 = this_00;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  }
  uVar1 = ((HasBits<1UL> *)&(in_RSI->_extensions_).flat_capacity_)->has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      _internal_name_abi_cxx11_((EnumValueDescriptorProto *)0x522a1f);
      _internal_set_name(in_RDI,in_stack_ffffffffffffff28);
    }
    if ((uVar1 & 2) != 0) {
      _internal_mutable_options(in_stack_ffffffffffffff10);
      _internal_options((EnumValueDescriptorProto *)in_RSI);
      EnumValueOptions::MergeFrom(in_RSI,in_stack_ffffffffffffff88);
    }
    if ((uVar1 & 4) != 0) {
      in_RDI->number_ = (in_RSI->_has_bits_).has_bits_[0];
    }
    (in_RDI->_has_bits_).has_bits_[0] = uVar1 | (in_RDI->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void EnumValueDescriptorProto::MergeFrom(const EnumValueDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_mutable_options()->PROTOBUF_NAMESPACE_ID::EnumValueOptions::MergeFrom(from._internal_options());
    }
    if (cached_has_bits & 0x00000004u) {
      number_ = from.number_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}